

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

Result __thiscall
Controller::generateBoard(Controller *this,BoardSize boardSize,BoardMode boardMode)

{
  bool bVar1;
  Board *this_00;
  
  if ((boardMode == GRAPHIC) && (bVar1 = isGraphic(this,boardSize), !bVar1)) {
    return CREATE_GRAPHIC_BOARD_NO_GRAPHIC;
  }
  this_00 = (Board *)operator_new(0x38);
  Board::Board(this_00,boardSize,boardMode);
  std::__uniq_ptr_impl<Board,_std::default_delete<Board>_>::reset
            ((__uniq_ptr_impl<Board,_std::default_delete<Board>_> *)this,this_00);
  Board::generateBoard
            ((this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
             super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
             super__Head_base<0UL,_Board_*,_false>._M_head_impl);
  UndoMove::Reset((this->undoMoveService)._M_t.
                  super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                  super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                  super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl);
  return OK;
}

Assistant:

Result Controller::generateBoard( BoardSize boardSize, BoardMode boardMode )
{
    if ( boardMode == BoardMode::GRAPHIC && ( isGraphic( boardSize ) == false ))
    {
        return Result::CREATE_GRAPHIC_BOARD_NO_GRAPHIC;
    }
    board.reset( new Board( boardSize, boardMode ));
    board->generateBoard();
    undoMoveService->Reset();
    return Result::OK;
}